

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivfenc.c
# Opt level: O3

void ivf_write_file_header(FILE *outfile,aom_codec_enc_cfg *cfg,uint fourcc,int frame_cnt)

{
  int iVar1;
  undefined8 local_28;
  undefined1 local_20;
  undefined1 local_1f;
  undefined1 local_1e;
  undefined1 local_1d;
  undefined2 local_1c;
  undefined2 local_1a;
  int local_18;
  undefined1 local_14;
  undefined1 local_13;
  undefined1 local_12;
  undefined1 local_11;
  undefined1 local_10;
  undefined1 local_f;
  undefined1 local_e;
  undefined1 local_d;
  undefined4 local_c;
  
  local_28 = 0x20000046494b44;
  local_20 = (undefined1)fourcc;
  local_1f = (undefined1)(fourcc >> 8);
  local_1e = (undefined1)(fourcc >> 0x10);
  local_1d = (undefined1)(fourcc >> 0x18);
  local_1c = (undefined2)cfg->g_w;
  local_1a = (undefined2)cfg->g_h;
  local_18 = (cfg->g_timebase).den;
  iVar1 = (cfg->g_timebase).num;
  local_14 = (undefined1)iVar1;
  local_13 = (undefined1)((uint)iVar1 >> 8);
  local_12 = (undefined1)((uint)iVar1 >> 0x10);
  local_11 = (undefined1)((uint)iVar1 >> 0x18);
  local_10 = (undefined1)frame_cnt;
  local_f = (undefined1)((uint)frame_cnt >> 8);
  local_e = (undefined1)((uint)frame_cnt >> 0x10);
  local_d = (undefined1)((uint)frame_cnt >> 0x18);
  local_c = 0;
  fwrite(&local_28,1,0x20,(FILE *)outfile);
  return;
}

Assistant:

void ivf_write_file_header(FILE *outfile, const struct aom_codec_enc_cfg *cfg,
                           unsigned int fourcc, int frame_cnt) {
  char header[32];

  header[0] = 'D';
  header[1] = 'K';
  header[2] = 'I';
  header[3] = 'F';
  mem_put_le16(header + 4, 0);                     // version
  mem_put_le16(header + 6, 32);                    // header size
  mem_put_le32(header + 8, fourcc);                // fourcc
  mem_put_le16(header + 12, cfg->g_w);             // width
  mem_put_le16(header + 14, cfg->g_h);             // height
  mem_put_le32(header + 16, cfg->g_timebase.den);  // rate
  mem_put_le32(header + 20, cfg->g_timebase.num);  // scale
  mem_put_le32(header + 24, frame_cnt);            // length
  mem_put_le32(header + 28, 0);                    // unused

  fwrite(header, 1, 32, outfile);
}